

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGCompareElemDefLists
              (xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict *def1,
              xmlRelaxNGDefinePtr_conflict *def2)

{
  int iVar1;
  xmlRelaxNGDefinePtr_conflict *basedef2;
  xmlRelaxNGDefinePtr_conflict *def2_local;
  xmlRelaxNGDefinePtr_conflict *def1_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  if ((((def1 != (xmlRelaxNGDefinePtr_conflict *)0x0) &&
       (def2 != (xmlRelaxNGDefinePtr_conflict *)0x0)) &&
      (*def1 != (xmlRelaxNGDefinePtr_conflict)0x0)) &&
     (def2_local = def1, *def2 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
    for (; basedef2 = def2, *def2_local != (xmlRelaxNGDefinePtr_conflict)0x0;
        def2_local = def2_local + 1) {
      for (; *basedef2 != (xmlRelaxNGDefinePtr_conflict)0x0; basedef2 = basedef2 + 1) {
        iVar1 = xmlRelaxNGCompareNameClasses(*def2_local,*basedef2);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

static int
xmlRelaxNGCompareElemDefLists(xmlRelaxNGParserCtxtPtr ctxt
                              ATTRIBUTE_UNUSED, xmlRelaxNGDefinePtr * def1,
                              xmlRelaxNGDefinePtr * def2)
{
    xmlRelaxNGDefinePtr *basedef2 = def2;

    if ((def1 == NULL) || (def2 == NULL))
        return (1);
    if ((*def1 == NULL) || (*def2 == NULL))
        return (1);
    while (*def1 != NULL) {
        while ((*def2) != NULL) {
            if (xmlRelaxNGCompareNameClasses(*def1, *def2) == 0)
                return (0);
            def2++;
        }
        def2 = basedef2;
        def1++;
    }
    return (1);
}